

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O3

ktx_error_code_e
texImage3DCallback(int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
                  void *pixels,void *userdata)

{
  GLenum GVar1;
  
  if (gl.glTexImage3D != (PFNGLTEXIMAGE3DPROC)0x0) {
    if (*(int *)((long)userdata + 0x14) != 0) {
      depth = *(int *)((long)userdata + 0x14);
    }
    (*gl.glTexImage3D)(face + *userdata,miplevel,*(GLint *)((long)userdata + 8),width,height,depth,0
                       ,*(GLenum *)((long)userdata + 4),*(GLenum *)((long)userdata + 0xc),pixels);
    GVar1 = (*gl.glGetError)();
    *(GLenum *)((long)userdata + 0x10) = GVar1;
    return (uint)(GVar1 != 0) * 9;
  }
  __assert_fail("gl.glTexImage3D != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                ,0x25c,
                "ktx_error_code_e texImage3DCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
               );
}

Assistant:

KTX_error_code
texImage3DCallback(int miplevel, int face,
                   int width, int height,
                   int depth,
                   ktx_uint64_t faceLodSize,
                   void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;
    UNUSED(faceLodSize);

    assert(gl.glTexImage3D != NULL);
    gl.glTexImage3D(cbData->glTarget + face, miplevel,
                   cbData->glInternalformat,
                   width, height,
                   cbData->numLayers == 0 ? (GLuint)depth : cbData->numLayers,
                   0,
                   cbData->glFormat, cbData->glType, pixels);

    if ((cbData->glError = glGetError()) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}